

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall helics::apps::Recorder::getValue_abi_cxx11_(Recorder *this,size_t index)

{
  bool bVar1;
  const_reference __elements;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__elements_1;
  const_reference pvVar2;
  const_reference this_00;
  size_type in_RDX;
  long in_RSI;
  tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
  *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined1 local_20 [8];
  size_type local_18;
  
  local_18 = in_RDX;
  bVar1 = isValidIndex<unsigned_long,std::vector<helics::apps::Recorder::ValueCapture,std::allocator<helics::apps::Recorder::ValueCapture>>>
                    ((unsigned_long)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    __elements = CLI::std::
                 vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                 ::operator[]((vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                               *)(in_RSI + 0xb8),local_18);
    __elements_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (in_RSI + 0x120);
    pvVar2 = CLI::std::
             vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
             ::operator[]((vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                           *)(in_RSI + 0xb8),local_18);
    this_00 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)__elements_1,(long)pvVar2->index);
    CLI::std::
    vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
    ::operator[]((vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                  *)(in_RSI + 0xb8),local_18);
    CLI::std::
    tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<const_TimeRepresentation<count_time<9,_long>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true,_true>
              ((tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_00,&__elements->time,__elements_1,in_stack_ffffffffffffff68);
  }
  else {
    memset(local_20,0,8);
    std::__cxx11::string::string(in_stack_ffffffffffffff80);
    std::__cxx11::string::string(in_stack_ffffffffffffff80);
    CLI::std::
    tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              ((tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffff80,
               (TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(in_stack_ffffffffffffff70);
    std::__cxx11::string::~string(in_stack_ffffffffffffff70);
  }
  return in_RDI;
}

Assistant:

std::tuple<Time, std::string_view, std::string> Recorder::getValue(std::size_t index) const
{
    if (isValidIndex(index, points)) {
        return {points[index].time, targets[points[index].index], points[index].value};
    }
    return {Time(), std::string(), std::string()};
}